

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_can.c
# Opt level: O0

int csp_can2_tx(csp_iface_t *iface,uint16_t via,csp_packet_t *packet,int from_me)

{
  uint uVar1;
  uint *puVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long in_RDX;
  ushort *in_RDI;
  int fragment_count;
  int data_bytes;
  uint32_t *header_extension;
  uint8_t *frame_buf;
  uint32_t frame_buf_mem [2];
  uint8_t frame_buf_inp;
  uint32_t can_id;
  int tx_count;
  int sender_count;
  csp_can_interface_data_t *ifdata;
  uint local_68;
  uint local_64;
  void *in_stack_ffffffffffffffb0;
  undefined1 *puVar7;
  csp_iface_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  char cVar8;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_38;
  int local_4;
  
  if (*(ushort *)(in_RDX + 0x26) == *in_RDI) {
    csp_qfifo_write((csp_packet_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    local_4 = 0;
  }
  else {
    puVar2 = *(uint **)(in_RDI + 8);
    uVar1 = *puVar2;
    *puVar2 = uVar1 + 1;
    cVar8 = '\0';
    uVar4 = (*(byte *)(in_RDX + 0x22) & 3) << 0x1b | (*(ushort *)(in_RDX + 0x26) & 0x3fff) << 0xd |
            (*in_RDI & 0x3f) << 7 | (uVar1 & 3) << 5 | 2;
    puVar7 = &stack0xffffffffffffffb8;
    __bswap_32((uint)*(ushort *)(in_RDX + 0x24) << 0x12 | (*(byte *)(in_RDX + 0x28) & 0x3f) << 0xc |
               (*(byte *)(in_RDX + 0x29) & 0x3f) << 6 | *(byte *)(in_RDX + 0x23) & 0x3f);
    bVar3 = cVar8 + 4;
    if (*(ushort *)(in_RDX + 0x20) < 4) {
      local_64 = (uint)*(ushort *)(in_RDX + 0x20);
    }
    else {
      local_64 = 4;
    }
    memcpy(puVar7 + (int)(uint)bVar3,(void *)(in_RDX + 0x40),(long)(int)local_64);
    if (local_64 == *(ushort *)(in_RDX + 0x20)) {
      uVar4 = uVar4 | 1;
    }
    local_68 = local_64;
    iVar5 = (**(code **)(puVar2 + 2))
                      (*(undefined8 *)(in_RDI + 0xc),uVar4,puVar7,bVar3 + (char)local_64);
    if (iVar5 == 0) {
      uVar4 = 1;
      for (local_38 = local_64; (int)local_38 < (int)(uint)*(ushort *)(in_RDX + 0x20);
          local_38 = local_68 + local_38) {
        uVar6 = uVar4 + 1;
        uVar4 = (uVar4 & 7) << 2 |
                (*(byte *)(in_RDX + 0x22) & 3) << 0x1b |
                (*(ushort *)(in_RDX + 0x26) & 0x3fff) << 0xd | (*in_RDI & 0x3f) << 7 |
                (uVar1 & 3) << 5;
        if ((int)(*(ushort *)(in_RDX + 0x20) - local_38) < 8) {
          local_68 = *(ushort *)(in_RDX + 0x20) - local_38;
        }
        else {
          local_68 = 8;
        }
        if (local_38 + local_68 == (uint)*(ushort *)(in_RDX + 0x20)) {
          uVar4 = uVar4 | 1;
        }
        iVar5 = (**(code **)(puVar2 + 2))
                          (*(undefined8 *)(in_RDI + 0xc),uVar4,in_RDX + 0x40 + (long)(int)local_38,
                           local_68 & 0xff);
        if (iVar5 != 0) {
          *(int *)(in_RDI + 0x1a) = *(int *)(in_RDI + 0x1a) + 1;
          return -0xb;
        }
        uVar4 = uVar6;
      }
      csp_buffer_free((void *)CONCAT44(local_68,uVar4));
      local_4 = 0;
    }
    else {
      *(int *)(in_RDI + 0x1a) = *(int *)(in_RDI + 0x1a) + 1;
      local_4 = -0xb;
    }
  }
  return local_4;
}

Assistant:

int csp_can2_tx(csp_iface_t * iface, uint16_t via, csp_packet_t * packet, int from_me) {

	/* Loopback */
	if (packet->id.dst == iface->addr) {
		csp_qfifo_write(packet, iface, NULL);
		return CSP_ERR_NONE;
	}

	csp_can_interface_data_t * ifdata = iface->interface_data;

	/* Setup counters */
	int sender_count = ifdata->cfp_packet_counter++;
	int tx_count = 0;

	uint32_t can_id = 0;
	uint8_t frame_buf_inp = 0;

	/* Pack mandatory fields of header */
	can_id = (((packet->id.pri & CFP2_PRIO_MASK) << CFP2_PRIO_OFFSET) |
			  ((packet->id.dst & CFP2_DST_MASK) << CFP2_DST_OFFSET) |
			  ((iface->addr & CFP2_SENDER_MASK) << CFP2_SENDER_OFFSET) |
			  ((sender_count & CFP2_SC_MASK) << CFP2_SC_OFFSET) |
			  ((1 & CFP2_BEGIN_MASK) << CFP2_BEGIN_OFFSET));

	/* Pack the rest of the CSP header in the first 32-bit of data */
    uint32_t frame_buf_mem[(CAN_FRAME_SIZE+sizeof(uint32_t)-1)/sizeof(uint32_t)];
    uint8_t *frame_buf = (uint8_t*)frame_buf_mem;
	uint32_t * header_extension = (uint32_t *)frame_buf_mem;

	*header_extension = (((packet->id.src & CFP2_SRC_MASK) << CFP2_SRC_OFFSET) |
						 ((packet->id.dport & CFP2_DPORT_MASK) << CFP2_DPORT_OFFSET) |
						 ((packet->id.sport & CFP2_SPORT_MASK) << CFP2_SPORT_OFFSET) |
						 ((packet->id.flags & CFP2_FLAGS_MASK) << CFP2_FLAGS_OFFSET));

	/* Convert to network byte order */
	*header_extension = htobe32(*header_extension);

	frame_buf_inp += 4;

	/* Copy first bytes of data field (max 4) */
	int data_bytes = (packet->length >= 4) ? 4 : packet->length;
	memcpy(frame_buf + frame_buf_inp, packet->data, data_bytes);
	frame_buf_inp += data_bytes;
	tx_count = data_bytes;

	/* Check for end condition */
	if (tx_count == packet->length) {
		can_id |= ((1 & CFP2_END_MASK) << CFP2_END_OFFSET);
	}

	/* Send first frame now */
	if ((ifdata->tx_func)(iface->driver_data, can_id, frame_buf, frame_buf_inp) != CSP_ERR_NONE) {
		iface->tx_error++;
		/* Does not free on return */
		return CSP_ERR_DRIVER;
	}

	/* Send next fragments if not complete */
	int fragment_count = 1;
	while (tx_count < packet->length) {

		/* Pack mandatory fields of header */
		can_id = (((packet->id.pri & CFP2_PRIO_MASK) << CFP2_PRIO_OFFSET) |
				  ((packet->id.dst & CFP2_DST_MASK) << CFP2_DST_OFFSET) |
				  ((iface->addr & CFP2_SENDER_MASK) << CFP2_SENDER_OFFSET) |
				  ((sender_count & CFP2_SC_MASK) << CFP2_SC_OFFSET));

		/* Set and increment fragment count */
		can_id |= (fragment_count++ & CFP2_FC_MASK) << CFP2_FC_OFFSET;

		/* Calculate frame data bytes */
		data_bytes = (packet->length - tx_count >= CAN_FRAME_SIZE) ? CAN_FRAME_SIZE : packet->length - tx_count;

		/* Check for end condition */
		if (tx_count + data_bytes == packet->length) {
			can_id |= ((1 & CFP2_END_MASK) << CFP2_END_OFFSET);
		}

		/* Send frame */
		if ((ifdata->tx_func)(iface->driver_data, can_id, packet->data + tx_count, data_bytes) != CSP_ERR_NONE) {
			iface->tx_error++;
			/* Does not free on return */
			return CSP_ERR_DRIVER;
		}

		/* Increment tx counter */
		tx_count += data_bytes;
	}

	csp_buffer_free(packet);

	return CSP_ERR_NONE;
}